

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

error_code __thiscall
simdjson::westmere::dom_parser_implementation::set_max_depth
          (dom_parser_implementation *this,size_t max_depth)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  open_container *poVar4;
  bool *__p;
  open_container *local_30;
  size_t max_depth_local;
  dom_parser_implementation *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = max_depth;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  poVar4 = (open_container *)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
  local_30 = (open_container *)0x0;
  if (poVar4 != (open_container *)0x0) {
    local_30 = poVar4;
  }
  std::
  unique_ptr<simdjson::westmere::open_container[],std::default_delete<simdjson::westmere::open_container[]>>
  ::reset<simdjson::westmere::open_container*,void>
            ((unique_ptr<simdjson::westmere::open_container[],std::default_delete<simdjson::westmere::open_container[]>>
              *)&this->open_containers,local_30);
  __p = (bool *)operator_new__(max_depth,(nothrow_t *)&std::nothrow);
  std::unique_ptr<bool[],std::default_delete<bool[]>>::reset<bool*,void>
            ((unique_ptr<bool[],std::default_delete<bool[]>> *)&this->is_array,__p);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->is_array);
  if ((bVar2) &&
     (bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->open_containers), bVar2))
  {
    (this->super_dom_parser_implementation)._max_depth = max_depth;
    this_local._4_4_ = SUCCESS;
  }
  else {
    (this->super_dom_parser_implementation)._max_depth = 0;
    this_local._4_4_ = MEMALLOC;
  }
  return this_local._4_4_;
}

Assistant:

inline simdjson_warn_unused error_code dom_parser_implementation::set_max_depth(size_t max_depth) noexcept {
  // Stage 2 stacks
  open_containers.reset(new (std::nothrow) open_container[max_depth]);
  is_array.reset(new (std::nothrow) bool[max_depth]);
  if (!is_array || !open_containers) { _max_depth = 0; return MEMALLOC; }

  _max_depth = max_depth;
  return SUCCESS;
}